

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O2

uint32_t FastLog2Slow_C(uint32_t v)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  uint32_t uVar4;
  double dVar5;
  
  if (v < 0x10000) {
    uVar1 = 0x1f;
    if (v != 0) {
      for (; v >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar3 = (uVar1 ^ 0xffffffe0) + 0x19;
    bVar2 = (byte)iVar3;
    uVar4 = iVar3 * 0x800000 + kLog2Table[v >> (bVar2 & 0x1f)];
    if (0xfff < v) {
      uVar4 = uVar4 + (int)(((ulong)(v >> 1) + (ulong)(~(-1 << (bVar2 & 0x1f)) & v) * 0xb8aa3b) /
                           (ulong)v);
    }
  }
  else {
    dVar5 = log((double)v);
    uVar4 = (uint32_t)(long)(dVar5 * 12102203.161561485 + 0.5);
  }
  return uVar4;
}

Assistant:

static uint32_t FastLog2Slow_C(uint32_t v) {
  assert(v >= LOG_LOOKUP_IDX_MAX);
  if (v < APPROX_LOG_WITH_CORRECTION_MAX) {
    const uint32_t orig_v = v;
    uint32_t log_2;
#if !defined(WEBP_HAVE_SLOW_CLZ_CTZ)
    // use clz if available
    const uint32_t log_cnt = BitsLog2Floor(v) - 7;
    const uint32_t y = 1 << log_cnt;
    v >>= log_cnt;
#else
    uint32_t log_cnt = 0;
    uint32_t y = 1;
    do {
      ++log_cnt;
      v = v >> 1;
      y = y << 1;
    } while (v >= LOG_LOOKUP_IDX_MAX);
#endif
    log_2 = kLog2Table[v] + (log_cnt << LOG_2_PRECISION_BITS);
    if (orig_v >= APPROX_LOG_MAX) {
      // Since the division is still expensive, add this correction factor only
      // for large values of 'v'.
      const uint64_t correction = LOG_2_RECIPROCAL_FIXED * (orig_v & (y - 1));
      log_2 += (uint32_t)DivRound(correction, orig_v);
    }
    return log_2;
  } else {
    return (uint32_t)(LOG_2_RECIPROCAL_FIXED_DOUBLE * log((double)v) + .5);
  }
}